

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_sha256_finalize(secp256k1_sha256 *hash,uchar *out32)

{
  int local_24;
  uchar local_20 [4];
  int i;
  uchar sizedesc [8];
  uchar *out32_local;
  secp256k1_sha256 *hash_local;
  
  sizedesc = (uchar  [8])out32;
  secp256k1_write_be32(local_20,(uint32_t)(hash->bytes >> 0x1d));
  secp256k1_write_be32((uchar *)&i,(uint32_t)(hash->bytes << 3));
  secp256k1_sha256_write
            (hash,secp256k1_sha256_finalize::pad,(0x77 - (hash->bytes & 0x3f) & 0x3f) + 1);
  secp256k1_sha256_write(hash,local_20,8);
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    secp256k1_write_be32((uchar *)((long)sizedesc + (long)(local_24 << 2)),hash->s[local_24]);
    hash->s[local_24] = 0;
  }
  return;
}

Assistant:

static void secp256k1_sha256_finalize(secp256k1_sha256 *hash, unsigned char *out32) {
    static const unsigned char pad[64] = {0x80};
    unsigned char sizedesc[8];
    int i;
    /* The maximum message size of SHA256 is 2^64-1 bits. */
    VERIFY_CHECK(hash->bytes < ((uint64_t)1 << 61));
    secp256k1_write_be32(&sizedesc[0], hash->bytes >> 29);
    secp256k1_write_be32(&sizedesc[4], hash->bytes << 3);
    secp256k1_sha256_write(hash, pad, 1 + ((119 - (hash->bytes % 64)) % 64));
    secp256k1_sha256_write(hash, sizedesc, 8);
    for (i = 0; i < 8; i++) {
        secp256k1_write_be32(&out32[4*i], hash->s[i]);
        hash->s[i] = 0;
    }
}